

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XIncludeUtils::isInCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *toFind)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XIncludeHistoryNode *pXVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  bool bVar6;
  bool bVar7;
  
  pXVar3 = this->fIncludeHistoryHead;
  do {
    bVar6 = pXVar3 != (XIncludeHistoryNode *)0x0;
    if ((!bVar6) || (pXVar4 = pXVar3->URI, pXVar4 == toFind)) {
      return bVar6;
    }
    if ((toFind == (XMLCh *)0x0) || (pXVar5 = toFind, pXVar4 == (XMLCh *)0x0)) {
      if (toFind == (XMLCh *)0x0) {
        if (pXVar4 == (XMLCh *)0x0) {
          return bVar6;
        }
LAB_003476f5:
        bVar7 = *pXVar4 == L'\0';
      }
      else {
        bVar7 = *toFind == L'\0';
        if (bVar7 && pXVar4 != (XMLCh *)0x0) goto LAB_003476f5;
      }
      if (bVar7) {
        return bVar6;
      }
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_003476f5;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
    pXVar3 = pXVar3->next;
  } while( true );
}

Assistant:

bool
XIncludeUtils::isInCurrentInclusionHistoryStack(const XMLCh *toFind){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    /* walk the list */
    while (historyCursor != NULL){
        if (XMLString::equals(toFind, historyCursor->URI)){
            return true;
        }
        historyCursor = historyCursor->next;
    }
    return false;
}